

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O0

LY_ERR lys_compile_unres_leafref
                 (lysc_ctx *ctx,lysc_node *node,lysc_type_leafref *lref,lysp_module *param_4)

{
  ly_ctx *ctx_00;
  undefined8 uVar1;
  uint16_t oper;
  LY_ERR LVar2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  long local_60;
  uint16_t local_4a;
  LY_ERR ret__;
  uint16_t flg;
  lysc_type *type;
  ly_path *p;
  lysc_node *target;
  lysp_module *local_mod_local;
  lysc_type_leafref *lref_local;
  lysc_node *node_local;
  lysc_ctx *ctx_local;
  
  p = (ly_path *)0x0;
  target = (lysc_node *)param_4;
  local_mod_local = (lysp_module *)lref;
  lref_local = (lysc_type_leafref *)node;
  node_local = (lysc_node *)ctx;
  if ((node->nodetype & 0xc) == 0) {
    __assert_fail("node->nodetype & (LYS_LEAF | LYS_LEAFLIST)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                  ,0x357,
                  "LY_ERR lys_compile_unres_leafref(struct lysc_ctx *, const struct lysc_node *, struct lysc_type_leafref *, const struct lysp_module *)"
                 );
  }
  if (lref->realtype == (lysc_type *)0x0) {
    oper = 1;
    if ((node->flags & 0x2000) != 0) {
      oper = 2;
    }
    ctx_local._4_4_ =
         ly_path_compile_leafref
                   (ctx->ctx,node,ctx->ext,lref->path,oper,0x20,LY_VALUE_SCHEMA_RESOLVED,
                    lref->prefixes,(ly_path **)&type);
    if (ctx_local._4_4_ == LY_SUCCESS) {
      if (type == (lysc_type *)0x0) {
        local_60 = 0;
      }
      else {
        local_60._0_4_ = type[-1].basetype;
        local_60._4_4_ = type[-1].refcount;
      }
      p = *(ly_path **)((long)type + (local_60 + -1) * 0x18);
      ly_path_free((ly_path *)type);
      if (((ulong)p->node & 0xc) == 0) {
        ctx_00 = *(ly_ctx **)node_local;
        uVar1 = *(undefined8 *)&local_mod_local->extensions->flags;
        pcVar3 = lys_nodetype2str(*(uint16_t *)&p->node);
        ly_vlog(ctx_00,(char *)0x0,LYVE_REFERENCE,
                "Invalid leafref path \"%s\" - target node is %s instead of leaf or leaf-list.",
                uVar1,pcVar3);
        ctx_local._4_4_ = LY_EVALID;
      }
      else {
        *(undefined1 *)&node_local[2].parent = 0;
        lysc_path((lysc_node *)lref_local,LYSC_PATH_LOG,(char *)&node_local[2].parent,0xfee);
        sVar4 = strlen((char *)&node_local[2].parent);
        *(int *)&node_local[1].ref = (int)sVar4;
        if (lref_local->exts == *(lysc_ext_instance **)target) {
          local_4a = *(uint16_t *)((long)&lref_local->name + 2);
        }
        else {
          local_4a = 4;
        }
        LVar2 = lysc_check_status((lysc_ctx *)node_local,local_4a,*(void **)target,
                                  (char *)lref_local->prefixes,*(uint16_t *)((long)&p->node + 2),
                                  p->ext,(char *)p[1].predicates);
        if (LVar2 == LY_SUCCESS) {
          *(undefined4 *)&node_local[1].ref = 1;
          *(undefined1 *)((long)&node_local[2].parent + 1) = 0;
          if (((*(char *)&local_mod_local->typedefs == '\0') ||
              (((ulong)lref_local->name & 0x10000) == 0)) || (((ulong)p->node & 0x20000) == 0)) {
            _ret__ = (lysp_module *)p[4].node;
            while( true ) {
              bVar5 = false;
              if (_ret__ != (lysp_module *)0x0) {
                bVar5 = *(int *)&_ret__->includes == 0xe;
              }
              if (!bVar5) {
                local_mod_local->identities = (lysp_ident *)p[4].node;
                *(int *)((long)&local_mod_local->identities->dsc + 4) =
                     *(int *)((long)&local_mod_local->identities->dsc + 4) + 1;
                return LY_SUCCESS;
              }
              if (_ret__ == local_mod_local) break;
              _ret__ = (lysp_module *)_ret__->identities;
            }
            ly_vlog(*(ly_ctx **)node_local,(char *)0x0,LYVE_REFERENCE,
                    "Invalid leafref path \"%s\" - circular chain of leafrefs detected.",
                    *(undefined8 *)&local_mod_local->extensions->flags);
            ctx_local._4_4_ = LY_EVALID;
          }
          else {
            ly_vlog(*(ly_ctx **)node_local,(char *)0x0,LYVE_REFERENCE,
                    "Invalid leafref path \"%s\" - target is supposed to represent configuration data (as the leafref does), but it does not."
                    ,*(undefined8 *)&local_mod_local->extensions->flags);
            ctx_local._4_4_ = LY_EVALID;
          }
        }
        else {
          ctx_local._4_4_ = LY_EVALID;
        }
      }
    }
  }
  else {
    ctx_local._4_4_ = LY_SUCCESS;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lys_compile_unres_leafref(struct lysc_ctx *ctx, const struct lysc_node *node, struct lysc_type_leafref *lref,
        const struct lysp_module *local_mod)
{
    const struct lysc_node *target = NULL;
    struct ly_path *p;
    struct lysc_type *type;
    uint16_t flg;

    assert(node->nodetype & (LYS_LEAF | LYS_LEAFLIST));

    if (lref->realtype) {
        /* already resolved, may happen (shared union typedef with a leafref) */
        return LY_SUCCESS;
    }

    /* try to find the target, current module is that of the context node (RFC 7950 6.4.1 second bullet) */
    LY_CHECK_RET(ly_path_compile_leafref(ctx->ctx, node, ctx->ext, lref->path,
            (node->flags & LYS_IS_OUTPUT) ? LY_PATH_OPER_OUTPUT : LY_PATH_OPER_INPUT, LY_PATH_TARGET_MANY,
            LY_VALUE_SCHEMA_RESOLVED, lref->prefixes, &p));

    /* get the target node */
    target = p[LY_ARRAY_COUNT(p) - 1].node;
    ly_path_free(p);

    if (!(target->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
        LOGVAL(ctx->ctx, LYVE_REFERENCE, "Invalid leafref path \"%s\" - target node is %s instead of leaf or leaf-list.",
                lref->path->expr, lys_nodetype2str(target->nodetype));
        return LY_EVALID;
    }

    /* check status */
    ctx->path[0] = '\0';
    lysc_path(node, LYSC_PATH_LOG, ctx->path, LYSC_CTX_BUFSIZE);
    ctx->path_len = strlen(ctx->path);
    if (node->module == local_mod->mod) {
        /* use flags of the context node since the definition is local */
        flg = node->flags;
    } else {
        /* definition is foreign (deviation), always current */
        flg = LYS_STATUS_CURR;
    }
    if (lysc_check_status(ctx, flg, local_mod->mod, node->name, target->flags, target->module, target->name)) {
        return LY_EVALID;
    }
    ctx->path_len = 1;
    ctx->path[1] = '\0';

    /* check config */
    if (lref->require_instance) {
        if ((node->flags & LYS_CONFIG_W) && (target->flags & LYS_CONFIG_R)) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE, "Invalid leafref path \"%s\" - target is supposed"
                    " to represent configuration data (as the leafref does), but it does not.", lref->path->expr);
            return LY_EVALID;
        }
    }

    /* check for circular chain of leafrefs */
    for (type = ((struct lysc_node_leaf *)target)->type;
            type && (type->basetype == LY_TYPE_LEAFREF);
            type = ((struct lysc_type_leafref *)type)->realtype) {
        if (type == (struct lysc_type *)lref) {
            /* circular chain detected */
            LOGVAL(ctx->ctx, LYVE_REFERENCE, "Invalid leafref path \"%s\" - circular chain of leafrefs detected.",
                    lref->path->expr);
            return LY_EVALID;
        }
    }

    /* store the type */
    lref->realtype = ((struct lysc_node_leaf *)target)->type;
    ++lref->realtype->refcount;
    return LY_SUCCESS;
}